

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall
ConnmanTestMsg::Handshake
          (ConnmanTestMsg *this,CNode *node,bool successfully_connected,ServiceFlags remote_services
          ,ServiceFlags param_4,int32_t version,bool relay_txs)

{
  CChainParams **ppCVar1;
  atomic<bool> *paVar2;
  long lVar3;
  ConnmanTestMsg *pCVar4;
  NetEventsInterface *pNVar5;
  string msg_type;
  string msg_type_00;
  int iVar6;
  undefined7 in_register_00000011;
  undefined4 uVar7;
  ConnmanTestMsg *pCVar8;
  char *__assertion;
  long in_FS_OFFSET;
  uint __line;
  unsigned_long *args_7;
  undefined4 in_stack_fffffffffffffe18;
  ConnmanTestMsg *pCVar9;
  uint in_stack_fffffffffffffe28;
  undefined4 uVar10;
  undefined8 uVar11;
  SerParams *local_1c8;
  CSerializedNetMsg *local_1c0;
  undefined8 local_1b8;
  SerParams *local_1b0;
  CNodeStateStats *local_1a8;
  long local_1a0 [2];
  Wrapper<CustomUintFormatter<8,_false>,_ServiceFlags_&> local_190;
  allocator<char> local_186;
  bool relay_txs_local;
  int32_t version_local;
  ServiceFlags remote_services_local;
  string local_178 [32];
  CSerializedNetMsg msg_verack;
  CNodeStateStats statestats;
  ParamsWrapper<CNetAddr::SerParams,_CService> local_b0;
  SerParams local_a0 [4];
  string local_90 [32];
  CSerializedNetMsg msg_version;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  relay_txs_local = relay_txs;
  pCVar4 = (ConnmanTestMsg *)(this->super_CConnman).m_msgproc;
  version_local = version;
  remote_services_local = remote_services;
  (***(_func_int ***)
      &(pCVar4->super_CConnman).m_total_bytes_sent_mutex.super_mutex.super___mutex_base._M_mutex)
            (pCVar4,node,param_4);
  pCVar8 = pCVar4;
  (*((_func_int **)
    (pCVar4->super_CConnman).m_total_bytes_sent_mutex.super_mutex.super___mutex_base._M_mutex.
    __align)[4])(pCVar4,node);
  FlushSendBuffer(pCVar8,node);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"version",&local_186);
  uVar7 = (undefined4)CONCAT71(in_register_00000011,successfully_connected);
  local_190.m_object = &remote_services_local;
  local_1a0[1] = 0;
  local_1a0[0] = 0;
  CService::CService((CService *)&statestats);
  local_1b0 = &CNetAddr::V1;
  local_1b8 = 0;
  args_7 = (unsigned_long *)0x692d8c;
  local_1a8 = &statestats;
  CService::CService((CService *)&msg_verack);
  local_1c8 = &CNetAddr::V1;
  uVar11 = 1;
  local_b0.m_params = local_a0;
  local_b0.m_object = (CService *)0x0;
  local_a0[0].enc._0_1_ = V1;
  uVar10 = 0;
  msg_type._M_string_length = (size_type)&local_1b8;
  msg_type._M_dataplus._M_p = (pointer)&local_1b0;
  msg_type.field_2._M_allocated_capacity = (size_type)&local_1c8;
  msg_type.field_2._8_8_ = &stack0xfffffffffffffe30;
  local_1c0 = &msg_verack;
  NetMsg::
  Make<int&,Wrapper<CustomUintFormatter<8,false>,ServiceFlags&>,long,long,ParamsWrapper<CNetAddr::SerParams,CService>,long,ParamsWrapper<CNetAddr::SerParams,CService>,unsigned_long,std::__cxx11::string,int,bool&>
            (&msg_version,(NetMsg *)local_90,msg_type,&version_local,&local_190,local_1a0 + 1,
             local_1a0,&local_b0,(long *)&stack0xfffffffffffffe2c,
             (ParamsWrapper<CNetAddr::SerParams,_CService> *)&relay_txs_local,args_7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(uVar7,in_stack_fffffffffffffe18),(int *)this,
             (bool *)(ulong)in_stack_fffffffffffffe28);
  std::__cxx11::string::~string((string *)&local_b0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&msg_verack);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&statestats);
  std::__cxx11::string::~string(local_90);
  pCVar9 = this;
  ReceiveMsgFrom(this,node,&msg_version);
  LOCK();
  (node->fPauseSend)._M_base._M_i = false;
  UNLOCK();
  pNVar5 = (this->super_CConnman).m_msgproc;
  paVar2 = &(this->super_CConnman).flagInterruptMsgProc;
  (*pNVar5->_vptr_NetEventsInterface[3])(pNVar5,node,paVar2);
  pCVar8 = pCVar4;
  (*((_func_int **)
    (pCVar4->super_CConnman).m_total_bytes_sent_mutex.super_mutex.super___mutex_base._M_mutex.
    __align)[4])(pCVar4,node);
  FlushSendBuffer(pCVar8,node);
  if (((node->fDisconnect)._M_base._M_i & 1U) != 0) {
LAB_00692ff7:
    CSerializedNetMsg::~CSerializedNetMsg(&msg_version);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      return;
    }
    __stack_chk_fail();
  }
  if ((node->nVersion).super___atomic_base<int>._M_i == version_local) {
    iVar6 = 0x11180;
    if (version_local < 0x11180) {
      iVar6 = version_local;
    }
    if ((node->m_greatest_common_version).super___atomic_base<int>._M_i == iVar6) {
      statestats.nSyncHeight = -1;
      statestats.nCommonHeight = -1;
      statestats.m_starting_height = -1;
      statestats.vHeightInFlight.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      statestats.vHeightInFlight.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      statestats.vHeightInFlight.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      statestats.m_addr_processed = 0;
      statestats.m_addr_rate_limited = 0;
      statestats.m_addr_relay_enabled = false;
      statestats.presync_height = -1;
      statestats.time_offset.__r = 0;
      ppCVar1 = &pCVar4[-1].super_CConnman.m_params;
      iVar6 = (**(code **)(((*ppCVar1)->consensus).BIP34Hash.super_base_blob<256U>.m_data._M_elems +
                          0x14))(ppCVar1,node->id,&statestats);
      if ((char)iVar6 == '\0') {
        __assertion = "peerman.GetNodeStateStats(node.GetId(), statestats)";
        __line = 0x3a;
      }
      else if (statestats.m_relay_txs == (bool)(node->m_conn_type != BLOCK_RELAY & relay_txs_local))
      {
        if (statestats.their_services == remote_services_local) {
          if ((char)uVar7 != '\0') {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_178,"verack",(allocator<char> *)&local_b0);
            msg_type_00._M_dataplus._M_p._4_4_ = uVar7;
            msg_type_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe18;
            msg_type_00._M_string_length = (size_type)pCVar9;
            msg_type_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffe28;
            msg_type_00.field_2._M_allocated_capacity._4_4_ = uVar10;
            msg_type_00.field_2._8_8_ = uVar11;
            NetMsg::Make<>(&msg_verack,msg_type_00);
            std::__cxx11::string::~string(local_178);
            ReceiveMsgFrom(this,node,&msg_verack);
            LOCK();
            (node->fPauseSend)._M_base._M_i = false;
            UNLOCK();
            pNVar5 = (this->super_CConnman).m_msgproc;
            (*pNVar5->_vptr_NetEventsInterface[3])(pNVar5,node,paVar2);
            (*((_func_int **)
              (pCVar4->super_CConnman).m_total_bytes_sent_mutex.super_mutex.super___mutex_base.
              _M_mutex.__align)[4])(pCVar4,node);
            if (((node->fSuccessfullyConnected)._M_base._M_i & 1U) == 0) {
              __assertion = "node.fSuccessfullyConnected == true";
              __line = 0x43;
              goto LAB_006930c1;
            }
            CSerializedNetMsg::~CSerializedNetMsg(&msg_verack);
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&statestats.vHeightInFlight.super__Vector_base<int,_std::allocator<int>_>);
          goto LAB_00692ff7;
        }
        __assertion = "statestats.their_services == remote_services";
        __line = 0x3c;
      }
      else {
        __assertion = "statestats.m_relay_txs == (relay_txs && !node.IsBlockOnlyConn())";
        __line = 0x3b;
      }
    }
    else {
      __assertion = "node.GetCommonVersion() == std::min(version, PROTOCOL_VERSION)";
      __line = 0x38;
    }
  }
  else {
    __assertion = "node.nVersion == version";
    __line = 0x37;
  }
LAB_006930c1:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/net.cpp"
                ,__line,
                "void ConnmanTestMsg::Handshake(CNode &, bool, ServiceFlags, ServiceFlags, int32_t, bool)"
               );
}

Assistant:

void ConnmanTestMsg::Handshake(CNode& node,
                               bool successfully_connected,
                               ServiceFlags remote_services,
                               ServiceFlags local_services,
                               int32_t version,
                               bool relay_txs)
{
    auto& peerman{static_cast<PeerManager&>(*m_msgproc)};
    auto& connman{*this};

    peerman.InitializeNode(node, local_services);
    peerman.SendMessages(&node);
    FlushSendBuffer(node); // Drop the version message added by SendMessages.

    CSerializedNetMsg msg_version{
        NetMsg::Make(NetMsgType::VERSION,
                version,                                        //
                Using<CustomUintFormatter<8>>(remote_services), //
                int64_t{},                                      // dummy time
                int64_t{},                                      // ignored service bits
                CNetAddr::V1(CService{}),                       // dummy
                int64_t{},                                      // ignored service bits
                CNetAddr::V1(CService{}),                       // ignored
                uint64_t{1},                                    // dummy nonce
                std::string{},                                  // dummy subver
                int32_t{},                                      // dummy starting_height
                relay_txs),
    };

    (void)connman.ReceiveMsgFrom(node, std::move(msg_version));
    node.fPauseSend = false;
    connman.ProcessMessagesOnce(node);
    peerman.SendMessages(&node);
    FlushSendBuffer(node); // Drop the verack message added by SendMessages.
    if (node.fDisconnect) return;
    assert(node.nVersion == version);
    assert(node.GetCommonVersion() == std::min(version, PROTOCOL_VERSION));
    CNodeStateStats statestats;
    assert(peerman.GetNodeStateStats(node.GetId(), statestats));
    assert(statestats.m_relay_txs == (relay_txs && !node.IsBlockOnlyConn()));
    assert(statestats.their_services == remote_services);
    if (successfully_connected) {
        CSerializedNetMsg msg_verack{NetMsg::Make(NetMsgType::VERACK)};
        (void)connman.ReceiveMsgFrom(node, std::move(msg_verack));
        node.fPauseSend = false;
        connman.ProcessMessagesOnce(node);
        peerman.SendMessages(&node);
        assert(node.fSuccessfullyConnected == true);
    }
}